

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

void __thiscall cmFileInstaller::cmFileInstaller(cmFileInstaller *this,cmFileCommand *command)

{
  cmMakefile *this_00;
  char *pcVar1;
  bool bVar2;
  char *__s;
  string install_always;
  string local_70;
  string local_50;
  
  cmFileCopier::cmFileCopier(&this->super_cmFileCopier,command,"INSTALL");
  (this->super_cmFileCopier)._vptr_cmFileCopier = (_func_int **)&PTR__cmFileInstaller_00668fc0;
  *(undefined4 *)&(this->super_cmFileCopier).field_0xc4 = 4;
  this->Optional = false;
  this->MessageAlways = false;
  this->MessageLazy = false;
  this->MessageNever = false;
  this->DestDirLength = 0;
  (this->Rename)._M_dataplus._M_p = (pointer)&(this->Rename).field_2;
  (this->Rename)._M_string_length = 0;
  (this->Rename).field_2._M_local_buf[0] = '\0';
  (this->Manifest)._M_dataplus._M_p = (pointer)&(this->Manifest).field_2;
  (this->Manifest)._M_string_length = 0;
  (this->Manifest).field_2._M_local_buf[0] = '\0';
  (this->super_cmFileCopier).UseSourcePermissions = false;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  bVar2 = cmsys::SystemTools::GetEnv("CMAKE_INSTALL_ALWAYS",&local_50);
  if (bVar2) {
    bVar2 = cmSystemTools::IsOn(local_50._M_dataplus._M_p);
    (this->super_cmFileCopier).Always = bVar2;
  }
  this_00 = (this->super_cmFileCopier).Makefile;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"CMAKE_INSTALL_MANIFEST_FILES","");
  __s = cmMakefile::GetSafeDefinition(this_00,&local_70);
  pcVar1 = (char *)(this->Manifest)._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&this->Manifest,0,pcVar1,(ulong)__s);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

cmFileInstaller(cmFileCommand* command)
    : cmFileCopier(command, "INSTALL")
    , InstallType(cmInstallType_FILES)
    , Optional(false)
    , MessageAlways(false)
    , MessageLazy(false)
    , MessageNever(false)
    , DestDirLength(0)
  {
    // Installation does not use source permissions by default.
    this->UseSourcePermissions = false;
    // Check whether to copy files always or only if they have changed.
    std::string install_always;
    if (cmSystemTools::GetEnv("CMAKE_INSTALL_ALWAYS", install_always)) {
      this->Always = cmSystemTools::IsOn(install_always.c_str());
    }
    // Get the current manifest.
    this->Manifest =
      this->Makefile->GetSafeDefinition("CMAKE_INSTALL_MANIFEST_FILES");
  }